

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall
cmGeneratorTarget::DiscoverSyntheticTargets
          (cmGeneratorTarget *this,cmSyntheticTargetCache *cache,string *config)

{
  pointer pcVar1;
  cmTarget *tgt;
  iterator __position;
  cmSyntheticTargetCache *cache_00;
  cmLocalGenerator *this_00;
  pointer pbVar2;
  bool bVar3;
  string *psVar4;
  iterator iVar5;
  cmTarget *this_01;
  cmFileSet *fs;
  _Head_base<0UL,_cmGeneratorTarget_*,_false> this_02;
  mapped_type *ppcVar6;
  vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *this_03;
  pointer name;
  pointer pcVar7;
  pair<cmFileSet_*,_bool> pVar8;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  string_view input;
  string_view input_00;
  cmGeneratorTarget *gt;
  cmGeneratorTarget *synthDep;
  __single_object gtp;
  string safeName;
  string dirhash;
  string targetName;
  cmCryptoHash hasher;
  string targetIdent;
  cmCxxModuleUsageEffects usage;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fsNames;
  cmOptionalLinkImplementation impl;
  cmGeneratorTarget *local_2c0;
  _Head_base<0UL,_cmGeneratorTarget_*,_false> local_2b8;
  cmSyntheticTargetCache *local_2b0;
  string local_2a8;
  string *local_270;
  mapped_type *local_268;
  __uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> local_260;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_258;
  size_type local_240;
  pointer local_238;
  undefined8 local_230;
  size_t local_228;
  char *local_220;
  string *local_218;
  size_type local_210;
  pointer local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  cmCryptoHash local_180;
  cmLocalGenerator *local_170;
  _Base_ptr local_168;
  cmMakefile *local_160;
  pointer local_158;
  string local_150;
  string local_130;
  cmCxxModuleUsageEffects local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  cmOptionalLinkImplementation local_d8;
  
  local_d8.super_cmLinkImplementation.LanguageRuntimeLibraries._M_h._M_buckets =
       &local_d8.super_cmLinkImplementation.LanguageRuntimeLibraries._M_h._M_single_bucket;
  local_d8.super_cmLinkImplementation.super_cmLinkImplementationLibraries.WrongConfigLibraries.
  super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_d8.super_cmLinkImplementation.super_cmLinkImplementationLibraries._65_8_ = 0;
  local_d8.super_cmLinkImplementation.super_cmLinkImplementationLibraries.WrongConfigLibraries.
  super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.super_cmLinkImplementation.super_cmLinkImplementationLibraries.WrongConfigLibraries.
  super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  local_d8.super_cmLinkImplementation.super_cmLinkImplementationLibraries.WrongConfigLibraries.
  super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  local_d8.super_cmLinkImplementation.super_cmLinkImplementationLibraries.Objects.
  super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_d8.super_cmLinkImplementation.super_cmLinkImplementationLibraries.Objects.
  super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.super_cmLinkImplementation.super_cmLinkImplementationLibraries.Libraries.
  super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.super_cmLinkImplementation.super_cmLinkImplementationLibraries.Objects.
  super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.super_cmLinkImplementation.super_cmLinkImplementationLibraries.Libraries.
  super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super_cmLinkImplementation.super_cmLinkImplementationLibraries.Libraries.
  super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super_cmLinkImplementation.Languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super_cmLinkImplementation.Languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super_cmLinkImplementation.Languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.super_cmLinkImplementation.LanguageRuntimeLibraries._M_h._M_bucket_count = 1;
  local_d8.super_cmLinkImplementation.LanguageRuntimeLibraries._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  local_d8.super_cmLinkImplementation.LanguageRuntimeLibraries._M_h._M_element_count = 0;
  local_d8.super_cmLinkImplementation.LanguageRuntimeLibraries._M_h._M_rehash_policy.
  _M_max_load_factor = 1.0;
  local_d8.super_cmLinkImplementation.LanguageRuntimeLibraries._M_h._M_rehash_policy._M_next_resize
       = 0;
  local_d8.super_cmLinkImplementation.LanguageRuntimeLibraries._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  local_d8.super_cmLinkImplementation.HadLinkLanguageSensitiveCondition = false;
  local_d8.super_cmLinkImplementation._161_3_ = 0;
  local_270 = config;
  ComputeLinkImplementationLibraries(this,config,&local_d8,this,Link);
  cmCxxModuleUsageEffects::cmCxxModuleUsageEffects(&local_110,this);
  local_2b0 = cache;
  local_268 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::InfoByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::InfoByConfig>_>_>
              ::operator[](&this->Configs,local_270);
  local_158 = local_d8.super_cmLinkImplementation.super_cmLinkImplementationLibraries.Libraries.
              super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (local_d8.super_cmLinkImplementation.super_cmLinkImplementationLibraries.Libraries.
      super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_d8.super_cmLinkImplementation.super_cmLinkImplementationLibraries.Libraries.
      super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_268 = (mapped_type *)&local_268->SyntheticDeps;
    local_168 = &(local_2b0->CxxModuleTargets)._M_t._M_impl.super__Rb_tree_header._M_header;
    pcVar7 = local_d8.super_cmLinkImplementation.super_cmLinkImplementationLibraries.Libraries.
             super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_2c0 = (pcVar7->super_cmLinkItem).Target;
      if (local_2c0 != (cmGeneratorTarget *)0x0) {
        bVar3 = cmTarget::IsImported(local_2c0->Target);
        if (bVar3) {
          bVar3 = HaveCxx20ModuleSources(local_2c0,(string *)0x0);
          if (bVar3) {
            cmCryptoHash::cmCryptoHash(&local_180,AlgoSHA3_512);
            psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                               (local_2c0->LocalGenerator);
            input._M_str = (psVar4->_M_dataplus)._M_p;
            input._M_len = psVar4->_M_string_length;
            cmCryptoHash::HashString_abi_cxx11_(&local_1c0,&local_180,input);
            psVar4 = cmTarget::GetName_abi_cxx11_(local_2c0->Target);
            local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
            pcVar1 = (psVar4->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1e0,pcVar1,pcVar1 + psVar4->_M_string_length);
            cmsys::SystemTools::ReplaceString(&local_1e0,":","_");
            psVar4 = cmCxxModuleUsageEffects::GetHash_abi_cxx11_(&local_110);
            local_258.first._M_len = 3;
            local_258.first._M_str = "@d_";
            local_258.second =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_240 = local_1c0._M_string_length;
            local_238 = local_1c0._M_dataplus._M_p;
            local_230 = 0;
            local_228 = 3;
            local_220 = "@u_";
            local_218 = (string *)0x0;
            local_208 = (psVar4->_M_dataplus)._M_p;
            local_210 = psVar4->_M_string_length;
            local_200 = 0;
            views._M_len = 4;
            views._M_array = &local_258;
            cmCatViews(&local_2a8,views);
            input_00._M_str = local_2a8._M_dataplus._M_p;
            input_00._M_len = local_2a8._M_string_length;
            cmCryptoHash::HashString_abi_cxx11_(&local_150,&local_180,input_00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
              operator_delete(local_2a8._M_dataplus._M_p,
                              (ulong)(local_2a8.field_2._M_allocated_capacity + 1));
            }
            std::__cxx11::string::substr((ulong)&local_2a8,(ulong)&local_150);
            local_258.first._M_len = local_1e0._M_string_length;
            local_258.first._M_str = local_1e0._M_dataplus._M_p;
            local_258.second =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_240 = 7;
            local_238 = "@synth_";
            local_230 = 0;
            local_228 = local_2a8._M_string_length;
            local_220 = local_2a8._M_dataplus._M_p;
            views_00._M_len = 3;
            views_00._M_array = &local_258;
            local_218 = &local_2a8;
            cmCatViews(&local_1a0,views_00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
              operator_delete(local_2a8._M_dataplus._M_p,
                              (ulong)(local_2a8.field_2._M_allocated_capacity + 1));
            }
            iVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                            *)local_2b0,&local_1a0);
            local_2b8._M_head_impl = (cmGeneratorTarget *)0x0;
            if (iVar5._M_node == local_168) {
              tgt = local_2c0->Target;
              local_160 = local_2c0->Makefile;
              local_170 = local_2c0->LocalGenerator;
              this_01 = cmMakefile::AddSynthesizedTarget(local_160,INTERFACE_LIBRARY,&local_1a0);
              cmTarget::CopyPolicyStatuses(this_01,tgt);
              cmTarget::GetAllFileSetNames_abi_cxx11_(&local_f0,tgt);
              pbVar2 = local_f0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (name = local_f0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start; name != pbVar2; name = name + 1
                  ) {
                fs = cmTarget::GetFileSet(tgt,name);
                if (fs == (cmFileSet *)0x0) {
                  psVar4 = cmTarget::GetName_abi_cxx11_(this_01);
                  local_258.first._M_len = 0x1f;
                  local_258.first._M_str = "Failed to find file set named \'";
                  local_258.second =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  local_238 = (name->_M_dataplus)._M_p;
                  local_240 = name->_M_string_length;
                  local_230 = 0;
                  local_228 = 0xd;
                  local_220 = "\' on target \'";
                  local_218 = (string *)0x0;
                  local_208 = (psVar4->_M_dataplus)._M_p;
                  local_210 = psVar4->_M_string_length;
                  local_200 = 0;
                  local_2a8._M_dataplus._M_p = (char *)0x0;
                  local_2a8._M_string_length = 1;
                  local_2a8.field_2._M_allocated_capacity = (long)&local_2a8.field_2 + 8;
                  local_2a8.field_2._M_local_buf[8] = '\'';
                  local_1f8 = 1;
                  local_1e8 = 0;
                  views_01._M_len = 5;
                  views_01._M_array = &local_258;
                  local_1f0 = (undefined1 *)local_2a8.field_2._M_allocated_capacity;
                  cmCatViews(&local_130,views_01);
                  cmMakefile::IssueMessage(local_160,INTERNAL_ERROR,&local_130);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_130._M_dataplus._M_p != &local_130.field_2) {
                    operator_delete(local_130._M_dataplus._M_p,
                                    local_130.field_2._M_allocated_capacity + 1);
                  }
                }
                else {
                  pVar8 = cmTarget::GetOrCreateFileSet(this_01,&fs->Name,&fs->Type,fs->Visibility);
                  cmFileSet::CopyEntries(pVar8.first,fs);
                }
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_f0);
              cmTarget::CopyImportedCxxModulesEntries(this_01,tgt);
              cmTarget::CopyImportedCxxModulesProperties(this_01,tgt);
              cmCxxModuleUsageEffects::ApplyToTarget(&local_110,this_01);
              this_02._M_head_impl = (cmGeneratorTarget *)operator_new(0xaa8);
              this_00 = local_170;
              cmGeneratorTarget(this_02._M_head_impl,this_01,local_170);
              cache_00 = local_2b0;
              local_2b8._M_head_impl = this_02._M_head_impl;
              local_258.first._M_len = (size_t)this_02._M_head_impl;
              ppcVar6 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                        ::operator[](&local_2b0->CxxModuleTargets,&local_1a0);
              *ppcVar6 = this_02._M_head_impl;
              DiscoverSyntheticTargets
                        ((cmGeneratorTarget *)local_258.first._M_len,cache_00,local_270);
              local_260._M_t.
              super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
              super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
                   (tuple<cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>)
                   (tuple<cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>)
                   local_258.first._M_len;
              local_258.first._M_len = 0;
              cmLocalGenerator::AddGeneratorTarget
                        (this_00,(unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                  *)&local_260);
              std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
              ~unique_ptr((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                          &local_260);
              std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
              ~unique_ptr((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                          &local_258);
            }
            else {
              local_2b8._M_head_impl = *(cmGeneratorTarget **)(iVar5._M_node + 2);
            }
            this_03 = (vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)
                      std::
                      map<const_cmGeneratorTarget_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                      ::operator[]((map<const_cmGeneratorTarget_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                                    *)local_268,&local_2c0);
            __position._M_current = *(cmGeneratorTarget ***)(this_03 + 8);
            if (__position._M_current == *(cmGeneratorTarget ***)(this_03 + 0x10)) {
              std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
              _M_realloc_insert<cmGeneratorTarget_const*const&>
                        (this_03,__position,&local_2b8._M_head_impl);
            }
            else {
              *__position._M_current = local_2b8._M_head_impl;
              *(long *)(this_03 + 8) = *(long *)(this_03 + 8) + 8;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1
                             );
            }
            cmCryptoHash::~cmCryptoHash(&local_180);
          }
        }
      }
      pcVar7 = pcVar7 + 1;
    } while (pcVar7 != local_158);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.Hash._M_dataplus._M_p != &local_110.Hash.field_2) {
    operator_delete(local_110.Hash._M_dataplus._M_p,local_110.Hash.field_2._M_allocated_capacity + 1
                   );
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_d8.super_cmLinkImplementation.LanguageRuntimeLibraries._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8.super_cmLinkImplementation.Languages);
  std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
            (&local_d8.super_cmLinkImplementation.super_cmLinkImplementationLibraries.
              WrongConfigLibraries);
  std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
            (&local_d8.super_cmLinkImplementation.super_cmLinkImplementationLibraries.Objects);
  std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::~vector
            ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)&local_d8);
  return true;
}

Assistant:

bool cmGeneratorTarget::DiscoverSyntheticTargets(cmSyntheticTargetCache& cache,
                                                 std::string const& config)
{
  cmOptionalLinkImplementation impl;
  this->ComputeLinkImplementationLibraries(config, impl, this,
                                           LinkInterfaceFor::Link);

  cmCxxModuleUsageEffects usage(this);

  auto& SyntheticDeps = this->Configs[config].SyntheticDeps;

  for (auto const& entry : impl.Libraries) {
    auto const* gt = entry.Target;
    if (!gt || !gt->IsImported()) {
      continue;
    }

    if (gt->HaveCxx20ModuleSources()) {
      cmCryptoHash hasher(cmCryptoHash::AlgoSHA3_512);
      constexpr size_t HASH_TRUNCATION = 12;
      auto dirhash = hasher.HashString(
        gt->GetLocalGenerator()->GetCurrentBinaryDirectory());
      std::string safeName = gt->GetName();
      cmSystemTools::ReplaceString(safeName, ":", "_");
      auto targetIdent =
        hasher.HashString(cmStrCat("@d_", dirhash, "@u_", usage.GetHash()));
      std::string targetName =
        cmStrCat(safeName, "@synth_", targetIdent.substr(0, HASH_TRUNCATION));

      // Check the cache to see if this instance of the imported target has
      // already been created.
      auto cached = cache.CxxModuleTargets.find(targetName);
      cmGeneratorTarget const* synthDep = nullptr;
      if (cached == cache.CxxModuleTargets.end()) {
        auto const* model = gt->Target;
        auto* mf = gt->Makefile;
        auto* lg = gt->GetLocalGenerator();
        auto* tgt = mf->AddSynthesizedTarget(cmStateEnums::INTERFACE_LIBRARY,
                                             targetName);

        // Copy relevant information from the existing IMPORTED target.

        // Copy policies to the target.
        tgt->CopyPolicyStatuses(model);

        // Copy file sets.
        {
          auto fsNames = model->GetAllFileSetNames();
          for (auto const& fsName : fsNames) {
            auto const* fs = model->GetFileSet(fsName);
            if (!fs) {
              mf->IssueMessage(MessageType::INTERNAL_ERROR,
                               cmStrCat("Failed to find file set named '",
                                        fsName, "' on target '",
                                        tgt->GetName(), '\''));
              continue;
            }
            auto* newFs = tgt
                            ->GetOrCreateFileSet(fs->GetName(), fs->GetType(),
                                                 fs->GetVisibility())
                            .first;
            newFs->CopyEntries(fs);
          }
        }

        // Copy imported C++ module properties.
        tgt->CopyImportedCxxModulesEntries(model);

        // Copy other properties which may affect the C++ module BMI
        // generation.
        tgt->CopyImportedCxxModulesProperties(model);

        // Apply usage requirements to the target.
        usage.ApplyToTarget(tgt);

        // Create the generator target and attach it to the local generator.
        auto gtp = cm::make_unique<cmGeneratorTarget>(tgt, lg);
        synthDep = gtp.get();
        cache.CxxModuleTargets[targetName] = synthDep;
        gtp->DiscoverSyntheticTargets(cache, config);
        lg->AddGeneratorTarget(std::move(gtp));
      } else {
        synthDep = cached->second;
      }

      SyntheticDeps[gt].push_back(synthDep);
    }
  }

  return true;
}